

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall ncnn::Deconvolution::load_model(Deconvolution *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffff30;
  Mat *m;
  Mat local_b8;
  undefined1 local_60 [72];
  long *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(local_60,in_RSI,in_RDI[3].c,0);
  ncnn::Mat::operator=(in_RDI,in_stack_ffffffffffffff30);
  ncnn::Mat::~Mat((Mat *)0x37d2a9);
  bVar1 = ncnn::Mat::empty(in_stack_ffffffffffffff30);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    if (in_RDI[3].d != 0) {
      m = &local_b8;
      (**(code **)(*local_18 + 0x10))(m,local_18,(int)in_RDI[2].cstep,1);
      ncnn::Mat::operator=(in_RDI,m);
      ncnn::Mat::~Mat((Mat *)0x37d34c);
      bVar1 = ncnn::Mat::empty(m);
      if (bVar1) {
        return -100;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Deconvolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}